

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

int INT_CMCondition_wait(CManager cm,int condition)

{
  CMControlList cl;
  pthread_t pVar1;
  int iVar2;
  CMCondition p_Var3;
  pthread_t pVar4;
  char *__format;
  
  cl = cm->control_list;
  iVar2 = CManager_locked(cm);
  if (iVar2 == 0) {
    __assert_fail("CManager_locked(cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                  ,0xd8,"int INT_CMCondition_wait(CManager, int)");
  }
  set_debug_flag(cm);
  if ((cm_control_debug_flag != 0) &&
     (fprintf((FILE *)cm->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",condition),
     cm_control_debug_flag != 0)) {
    fwrite("CMLowLevel locked cl\n",0x15,1,(FILE *)cm->CMTrace_file);
  }
  p_Var3 = CMCondition_find(cl,condition);
  if (p_Var3 == (CMCondition)0x0) {
    return -1;
  }
  if (p_Var3->signaled != 0) {
    iVar2 = 1;
    if (cm_control_debug_flag == 0) {
      return 1;
    }
    __format = "CMcondition %d already signalled\n";
    goto LAB_0012149e;
  }
  if (p_Var3->failed != 0) {
    iVar2 = 0;
    if (cm_control_debug_flag == 0) {
      return 0;
    }
    __format = "CMcondition %d already failed\n";
    goto LAB_0012149e;
  }
  p_Var3->waiting = p_Var3->waiting + 1;
  if (cm_control_debug_flag != 0) {
    fprintf((FILE *)cm->CMTrace_file,"CMLowLevel In condition wait, server thread = %p\n",
            cl->server_thread);
  }
  if (cl->has_thread == 0) {
    pVar1 = cl->server_thread;
    if ((pVar1 != 0) && (pVar4 = pthread_self(), pVar1 != pVar4)) {
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)cm->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",condition);
      }
      iVar2 = CManager_locked(cm);
      if (iVar2 == 0) {
        __assert_fail("CManager_locked(cm)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                      ,0x10f,"int INT_CMCondition_wait(CManager, int)");
      }
      goto LAB_00121437;
    }
    cl->cond_polling = 1;
    while ((iVar2 = cm_control_debug_flag, p_Var3->signaled == 0 && (p_Var3->failed == 0))) {
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)cm->CMTrace_file,"CMLowLevel  Polling for CMcondition %d\n",condition);
      }
      CMcontrol_list_wait(cl);
    }
    cl->cond_polling = 0;
    if (iVar2 == 0) {
      cl->server_thread = 0;
    }
    else {
      fprintf((FILE *)cm->CMTrace_file,"CMLowLevel  after Polling for CMcondition %d\n",condition);
      iVar2 = cm_control_debug_flag;
      cl->server_thread = 0;
      if (iVar2 != 0) {
        fprintf((FILE *)cm->CMTrace_file,
                "CMLowLevel  In condition wait, reset server thread = %lx\n",0);
      }
    }
  }
  else {
    pVar4 = pthread_self();
    if (pVar4 == cl->server_thread) {
      cl->cond_polling = 1;
      while ((p_Var3->signaled == 0 && (p_Var3->failed == 0))) {
        if (cm_control_debug_flag != 0) {
          fprintf((FILE *)cm->CMTrace_file,"CMLowLevel polling for CMcondition %d\n",condition);
        }
        CMcontrol_list_wait(cl);
        if (cl->closed != 0) {
          p_Var3->failed = 1;
        }
      }
      cl->cond_polling = 0;
    }
    else {
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)cm->CMTrace_file,"CMLowLevel Waiting for CMcondition %d\n",condition);
      }
      iVar2 = CManager_locked(cm);
      if (iVar2 == 0) {
        __assert_fail("CManager_locked(cm)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cm_control.c"
                      ,0x129,"int INT_CMCondition_wait(CManager, int)");
      }
LAB_00121437:
      cm->locked = cm->locked + -1;
      pthread_cond_wait((pthread_cond_t *)&p_Var3->cond_condition,
                        (pthread_mutex_t *)&cm->exchange_lock);
      cm->locked = cm->locked + 1;
      if (cm_control_debug_flag != 0) {
        fprintf((FILE *)cm->CMTrace_file,"CMLowLevel After wait for CMcondition %d\n",condition);
      }
    }
  }
  iVar2 = p_Var3->signaled;
  CMCondition_destroy(cl,condition);
  if (cm_control_debug_flag == 0) {
    return iVar2;
  }
  __format = "CMLowLevel Return from wait CMcondition %d\n";
LAB_0012149e:
  fprintf((FILE *)cm->CMTrace_file,__format,condition);
  return iVar2;
}

Assistant:

extern int
INT_CMCondition_wait(CManager cm, int condition)
{
    CMCondition cond;
    CMControlList cl = cm->control_list;
    int result;

    assert(CManager_locked(cm));
    set_debug_flag(cm);
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", condition);
    }
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel locked cl\n");
    }
    cond = CMCondition_find(cl, condition);

    if (cond == NULL) return -1;
    if (cond->signaled) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMcondition %d already signalled\n", condition);
	}
	return 1;
    }
    if (cond->failed) {
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMcondition %d already failed\n", condition);
	}
	return 0;
    }
    cond->waiting++;
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel In condition wait, server thread = %p\n", 
	       (void*)(intptr_t)cl->server_thread);
    }
    if (!cl->has_thread) {
	if ((cl->server_thread ==  (thr_thread_id) 0) || (cl->server_thread == thr_thread_self())) {
	    cl->cond_polling = 1;
	    while (!(cond->signaled || cond->failed)) {
		if (cm_control_debug_flag) {
		    fprintf(cm->CMTrace_file, "CMLowLevel  Polling for CMcondition %d\n", condition);
		}
		CMcontrol_list_wait(cl);
	    }
	    cl->cond_polling = 0;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel  after Polling for CMcondition %d\n", condition);
	    }
	    /* the poll and handle will set cl->server_thread, restore it */
	    cl->server_thread =  (thr_thread_id) (intptr_t)NULL;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel  In condition wait, reset server thread = %lx\n", 
		       (long)cl->server_thread);
	    }
	} else {
	    /* some other thread is servicing the network here 
	       hopefully they'll keep doing it */
	    /* some other thread is the server thread */
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", 
		       condition);
	    }
	    assert(CManager_locked(cm));
	    cm->locked--;
	    thr_condition_wait(cond->cond_condition, cm->exchange_lock);
	    cm->locked++;
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel After wait for CMcondition %d\n", 
		       condition);
	    }
	}
    } else if (thr_thread_self() == cl->server_thread) {
	/* we're the server thread */
	cl->cond_polling = 1;
	while (!(cond->signaled || cond->failed)) {
	    if (cm_control_debug_flag) {
		fprintf(cm->CMTrace_file, "CMLowLevel polling for CMcondition %d\n", condition);
	    }
	    CMcontrol_list_wait(cl);
	    if (cl->closed) cond->failed = 1;
	}
	cl->cond_polling = 0;
    } else {
	/* some other thread is the server thread */
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel Waiting for CMcondition %d\n", 
		   condition);
	}
	assert(CManager_locked(cm));
	cm->locked--;
	thr_condition_wait(cond->cond_condition, cm->exchange_lock);
	cm->locked++;
	if (cm_control_debug_flag) {
	    fprintf(cm->CMTrace_file, "CMLowLevel After wait for CMcondition %d\n", 
		   condition);
	}
    }
    result = cond->signaled;
    CMCondition_destroy(cl, condition);
    if (cm_control_debug_flag) {
	fprintf(cm->CMTrace_file, "CMLowLevel Return from wait CMcondition %d\n", condition);
    }
    return result;
}